

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

BailOutInstrTemplate<IR::ProfiledInstr> * __thiscall
IR::BailOutInstrTemplate<IR::ProfiledInstr>::CloneBailOut
          (BailOutInstrTemplate<IR::ProfiledInstr> *this)

{
  BailOutInfo *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BailOutInstrTemplate<IR::ProfiledInstr> *pBVar5;
  
  if ((((this->super_ProfiledInstr).super_Instr.m_func)->field_0x240 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5ed,"(this->m_func->hasBailout)","this->m_func->hasBailout");
    if (!bVar3) goto LAB_004c5705;
    *puVar4 = 0;
  }
  if (this->bailOutInfo->wasCloned == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x5ee,"(!this->bailOutInfo->wasCloned)","!this->bailOutInfo->wasCloned");
    if (!bVar3) {
LAB_004c5705:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar5 = New((this->super_ProfiledInstr).super_Instr.m_opcode,this->bailOutKind,this->bailOutInfo,
               this->bailOutInfo->bailOutFunc);
  (pBVar5->super_ProfiledInstr).super_Instr.field_0x38 =
       (pBVar5->super_ProfiledInstr).super_Instr.field_0x38 & 0xbf |
       (this->super_ProfiledInstr).super_Instr.field_0x38 & 0x40;
  pBVar5->auxBailOutKind = this->auxBailOutKind;
  pBVar1 = pBVar5->bailOutInfo;
  pBVar1->wasCloned = true;
  pBVar1->bailOutInstr = (Instr *)pBVar5;
  return pBVar5;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::CloneBailOut() const
{
    Assert(this->m_func->hasBailout);
    Assert(!this->bailOutInfo->wasCloned);

    BailOutInstrTemplate * bailOutInstr = BailOutInstrTemplate::New(this->m_opcode, this->bailOutKind, this->bailOutInfo, this->bailOutInfo->bailOutFunc);
    bailOutInstr->hasAuxBailOut = this->hasAuxBailOut;
    bailOutInstr->auxBailOutKind = this->auxBailOutKind;
    bailOutInstr->bailOutInfo->wasCloned = true;

    // the new copy is in the slow path and generate the real bailout
    bailOutInstr->bailOutInfo->bailOutInstr = bailOutInstr;

    return bailOutInstr;
}